

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

Option * __thiscall CLI::App::set_help_flag(App *this,string *flag_name,string *help_description)

{
  ulong uVar1;
  Option *pOVar2;
  string local_40;
  string *local_20;
  string *help_description_local;
  string *flag_name_local;
  App *this_local;
  
  local_20 = help_description;
  help_description_local = flag_name;
  flag_name_local = (string *)this;
  if (this->help_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_ptr_);
    this->help_ptr_ = (Option *)0x0;
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_40,(string *)flag_name);
    pOVar2 = add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (this,&local_40,local_20);
    this->help_ptr_ = pOVar2;
    ::std::__cxx11::string::~string((string *)&local_40);
    OptionBase<CLI::Option>::configurable(&this->help_ptr_->super_OptionBase<CLI::Option>,false);
  }
  return this->help_ptr_;
}

Assistant:

CLI11_INLINE Option *App::set_help_flag(std::string flag_name, const std::string &help_description) {
    // take flag_description by const reference otherwise add_flag tries to assign to help_description
    if(help_ptr_ != nullptr) {
        remove_option(help_ptr_);
        help_ptr_ = nullptr;
    }

    // Empty name will simply remove the help flag
    if(!flag_name.empty()) {
        help_ptr_ = add_flag(flag_name, help_description);
        help_ptr_->configurable(false);
    }

    return help_ptr_;
}